

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

BOOL Js::JavascriptProxy::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *requestContext,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  BOOL BVar5;
  int iVar6;
  JavascriptProxy *this_00;
  Var pvVar7;
  RecyclableObject *obj_00;
  JavascriptFunction *function;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptMethod p_Var10;
  RecyclableObject *ptr;
  PropertyRecord *pPVar11;
  undefined1 local_90 [8];
  PropertyDescriptor targetDescriptor;
  
  ThreadContext::ProbeStack(requestContext->threadContext,0xc00,requestContext,(PVOID)0x0);
  this = requestContext->threadContext;
  if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
  pvVar7 = CrossSite::MarshalVar(requestContext,(this_00->handler).ptr,false);
  if (pvVar7 == (Var)0x0) {
    bVar3 = ThreadContext::RecordImplicitException(this);
    if (!bVar3) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"definePropertyDescriptor");
  }
  obj_00 = (RecyclableObject *)CrossSite::MarshalVar(requestContext,(this_00->target).ptr,false);
  function = GetMethodHelper(this_00,0x19c,requestContext);
  bVar3 = Memory::Recycler::IsHeapEnumInProgress(requestContext->recycler);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x6cc,"(!requestContext->IsHeapEnumInProgress())",
                                "!requestContext->IsHeapEnumInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar5 = JavascriptOperators::DefineOwnPropertyDescriptor
                      (obj_00,propId,descriptor,throwOnError,requestContext,flags);
    return BVar5;
  }
  targetDescriptor._40_8_ = JavascriptOperators::FromPropertyDescriptor(descriptor,requestContext);
  pvVar9 = GetName(requestContext,propId);
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)function,attributes);
  if (bVar4) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var10)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                     pvVar7,obj_00,pvVar9,targetDescriptor._40_8_);
    bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00cfd0d8:
    if (bVar4 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (this->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var10);
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var10)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                       pvVar7,obj_00,pvVar9,targetDescriptor._40_8_);
      bVar4 = ThreadContext::IsOnStack(ptr);
      goto LAB_00cfd0d8;
    }
    IVar1 = this->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var10)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                     pvVar7,obj_00,pvVar9,targetDescriptor._40_8_);
    this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  this->reentrancySafeOrHandled = bVar3;
  BVar5 = JavascriptConversion::ToBoolean(ptr,requestContext);
  if (BVar5 == 0) {
    BVar5 = 0;
    if (throwOnError && (flags & PropertyOperation_StrictMode) != PropertyOperation_None) {
      pPVar11 = ScriptContext::GetPropertyName(requestContext,propId);
      JavascriptError::ThrowTypeErrorVar(requestContext,-0x7ff5e9d4,L"defineProperty",pPVar11 + 1);
    }
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_90);
    BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                      (obj_00,propId,requestContext,(PropertyDescriptor *)local_90);
    iVar6 = (*(obj_00->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])(obj_00);
    if (descriptor->configurableSpecified == true) {
      bVar3 = PropertyDescriptor::IsConfigurable(descriptor);
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
    if (BVar5 == 0) {
      if (!(bool)(iVar6 != 0 & (bVar3 ^ 1U))) goto LAB_00cfd388;
    }
    else {
      BVar5 = JavascriptOperators::IsCompatiblePropertyDescriptor
                        (descriptor,(PropertyDescriptor *)local_90,iVar6 != 0,true,requestContext);
      if ((BVar5 == 0) ||
         ((bVar3 && (bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_90),
                    bVar3)))) {
LAB_00cfd388:
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
      }
    }
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL JavascriptProxy::DefineOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* requestContext, PropertyOperationFlags flags)
    {
        // #sec-proxy-object-internal-methods-and-internal-slots-defineownproperty-p-desc
        PROBE_STACK(requestContext, Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        JavascriptProxy* proxy = VarTo<JavascriptProxy>(obj);

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be O.[[ProxyHandler]].
        RecyclableObject *handlerObj = proxy->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        //4. Assert: Type(handler) is Object.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("definePropertyDescriptor"));
        }

        //5. Let target be O.[[ProxyTarget]].
        RecyclableObject *targetObj = proxy->MarshalTarget(requestContext);

        //6. Let trap be ? GetMethod(handler, "defineProperty").
        //7. If trap is undefined, then
        //a. Return ? target.[[DefineOwnProperty]](P, Desc).
        JavascriptFunction* defineOwnPropertyMethod = proxy->GetMethodHelper(PropertyIds::defineProperty, requestContext);

        Assert(!requestContext->IsHeapEnumInProgress());
        if (nullptr == defineOwnPropertyMethod)
        {
            return JavascriptOperators::DefineOwnPropertyDescriptor(targetObj, propId, descriptor, throwOnError, requestContext, flags);
        }

        //8. Let descObj be FromPropertyDescriptor(Desc).
        //9. Let booleanTrapResult be ToBoolean(? Call(trap, handler, << target, P, descObj >> )).
        //10. If booleanTrapResult is false, then return false.
        //11. Let targetDesc be ? target.[[GetOwnProperty]](P).
        Var descVar = JavascriptOperators::FromPropertyDescriptor(descriptor, requestContext);

        Var propertyName = GetName(requestContext, propId);

        Var definePropertyResult = threadContext->ExecuteImplicitCall(defineOwnPropertyMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, defineOwnPropertyMethod, CallInfo(CallFlags_Value, 4), handlerObj, targetObj, propertyName, descVar);
        });

        BOOL defineResult = JavascriptConversion::ToBoolean(definePropertyResult, requestContext);
        if (!defineResult)
        {
            if (throwOnError && flags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext,
                    JSERR_ProxyHandlerReturnedFalse,
                    _u("defineProperty"),
                    requestContext->GetPropertyName(propId)->GetBuffer()
                );
            }
            return defineResult;
        }

        //12. Let extensibleTarget be ? IsExtensible(target).
        //13. If Desc has a[[Configurable]] field and if Desc.[[Configurable]] is false, then
        //    a.Let settingConfigFalse be true.
        //14. Else let settingConfigFalse be false.
        //15. If targetDesc is undefined, then
        //    a.If extensibleTarget is false, then throw a TypeError exception.
        //    b.If settingConfigFalse is true, then throw a TypeError exception.
        //16. Else targetDesc is not undefined,
        //    a.If IsCompatiblePropertyDescriptor(extensibleTarget, Desc, targetDesc) is false, then throw a TypeError exception.
        //    b.If settingConfigFalse is true and targetDesc.[[Configurable]] is true, then throw a TypeError exception.
        //17. Return true.
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propId, requestContext, &targetDescriptor);
        BOOL isExtensible = targetObj->IsExtensible();
        BOOL settingConfigFalse = (descriptor.ConfigurableSpecified() && !descriptor.IsConfigurable());
        if (!hasProperty)
        {
            if (!isExtensible || settingConfigFalse)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
        }
        else
        {
            if (!JavascriptOperators::IsCompatiblePropertyDescriptor(descriptor, hasProperty? &targetDescriptor : nullptr, !!isExtensible, true, requestContext))
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
            if (settingConfigFalse && targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
        }
        return TRUE;
    }